

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

CharSetNode * __thiscall
UnifiedRegex::CharSetLeaf::Set(CharSetLeaf *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2d7,"(level == 0)","level == 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  CharBitvec::SetRange(&this->vec,l & 0xff,h & 0xff);
  if ((this->vec).vec[0] == 0xffffffff) {
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      if (uVar5 == 7) break;
      uVar2 = uVar5 + 1;
    } while ((this->vec).vec[uVar5 + 1] == 0xffffffff);
    if (6 < uVar5) {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (&allocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,this,0x28
                );
      this = (CharSetLeaf *)&CharSetFull::Instance;
    }
  }
  return &this->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetLeaf::Set(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level == 0);
        vec.SetRange(leafIdx(l), leafIdx(h));
        if (vec.IsFull())
        {
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }